

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dct.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> *
calc_avg(vector<double,_std::allocator<double>_> *__return_storage_ptr__,
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        *history,vector<double,_std::allocator<double>_> *new_values,size_t avg_amount)

{
  pointer pvVar1;
  long lVar2;
  double *pdVar3;
  double *d;
  ulong uVar4;
  pointer pdVar5;
  double *pdVar6;
  undefined8 uVar7;
  long lVar8;
  ulong uVar9;
  pointer pdVar10;
  vector<double,_std::allocator<double>_> *__range1;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,new_values);
  uVar4 = ((long)(history->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(history->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 + 1;
  if (avg_amount <= uVar4) {
    uVar4 = avg_amount;
  }
  if (uVar4 != 0) {
    uVar14 = 0;
    do {
      pvVar1 = (history->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar9 = ((long)(history->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
              -0x5555555555555555;
      uVar12 = ~(uint)uVar14 + (int)uVar9;
      if (((int)uVar12 < 0) || ((int)uVar9 <= (int)uVar12)) break;
      uVar13 = (ulong)(uVar12 & 0x7fffffff);
      if (uVar9 < uVar13 || uVar9 - uVar13 == 0) {
LAB_00103b74:
        uVar7 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar13);
        pdVar5 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        if (pdVar5 != (pointer)0x0) {
          operator_delete(pdVar5);
        }
        _Unwind_Resume(uVar7);
      }
      pdVar5 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_start;
      pdVar10 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      lVar8 = (long)pdVar10 - (long)pdVar5;
      if ((long)*(pointer *)
                 ((long)&pvVar1[uVar13].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + 8) -
          *(long *)&pvVar1[uVar13].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data != lVar8) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ERROR: history and result size mismatch!",0x28);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
        std::ostream::put('H');
        std::ostream::flush();
        pdVar5 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        pdVar10 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        lVar8 = (long)pdVar10 - (long)pdVar5;
      }
      if (pdVar10 != pdVar5) {
        pvVar1 = (history->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar9 = ((long)(history->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
                -0x5555555555555555;
        if (uVar9 < uVar13 || uVar9 - uVar13 == 0) {
LAB_00103b63:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar13,uVar9);
          goto LAB_00103b74;
        }
        lVar2 = *(long *)&pvVar1[uVar13].super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data;
        uVar9 = (long)*(pointer *)
                       ((long)&pvVar1[uVar13].super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data + 8) - lVar2 >> 3;
        uVar11 = 0;
        do {
          uVar13 = uVar9;
          if (uVar9 == uVar11) goto LAB_00103b63;
          pdVar5[uVar11] = *(double *)(lVar2 + uVar11 * 8) + pdVar5[uVar11];
          uVar11 = uVar11 + 1;
        } while ((lVar8 >> 3) + (ulong)(lVar8 >> 3 == 0) != uVar11);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar4);
  }
  pdVar6 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar6 != pdVar3) {
    do {
      *pdVar6 = *pdVar6 / (((double)CONCAT44(0x45300000,(int)(uVar4 >> 0x20)) -
                           1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0));
      pdVar6 = pdVar6 + 1;
    } while (pdVar6 != pdVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<double> calc_avg(const vector<vector<double>>& history,
                             const vector<double>& new_values,
                             size_t avg_amount) {
    vector<double> result(new_values);

    // If we don't have enough values yet, use what's there (+ 1 because new values)
    avg_amount = std::min(avg_amount, history.size() + 1);

    for (size_t i = 0; i < avg_amount; i++) {
        const int index = history.size() - 1 - i;

        if (index < 0 || index >= (int)history.size()) {
            break;
        }

        if (history.at(index).size() != result.size()) {
            // TODO make this an assert
            cout << "ERROR: history and result size mismatch!" << endl;
        }

        for (size_t j = 0; j < result.size(); j++) {
            result.at(j) += history.at(index).at(j);
        }
    }

    for(double& d : result) {
        d /= avg_amount;
    }

    return result;
}